

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O2

void embree::avx2::
     BVHNIntersectorKHybrid<8,_4,_16777232,_true,_embree::avx2::ArrayIntersectorK_1<4,_embree::avx2::TriangleMiMBIntersectorKPluecker<4,_4,_true>_>,_true>
     ::intersect1(Intersectors *This,BVH *bvh,NodeRef root,size_t k,Precalculations *pre,
                 RayHitK<4> *ray,TravRayK<4,_true> *tray,RayQueryContext *context)

{
  undefined8 *puVar1;
  int iVar2;
  undefined4 uVar3;
  uint uVar4;
  uint uVar5;
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  byte bVar9;
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined4 uVar14;
  AABBNodeMB4D *node1;
  ulong uVar15;
  long lVar16;
  RayHitK<4> *pRVar17;
  uint uVar18;
  ulong uVar20;
  undefined1 (*pauVar21) [16];
  ulong uVar22;
  long lVar23;
  Scene *pSVar24;
  ulong uVar25;
  ulong uVar26;
  ulong uVar27;
  ulong uVar28;
  ulong uVar29;
  ulong uVar30;
  ulong uVar31;
  ulong uVar32;
  long lVar33;
  Geometry *pGVar34;
  ulong uVar35;
  ulong uVar36;
  undefined1 (*pauVar37) [16];
  ulong uVar38;
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [64];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [32];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [64];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [64];
  undefined1 auVar94 [64];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [64];
  float fVar102;
  float fVar104;
  float fVar105;
  float fVar106;
  undefined1 auVar103 [16];
  float fVar107;
  float fVar108;
  float fVar109;
  float fVar110;
  float fVar111;
  float fVar112;
  float fVar113;
  float fVar115;
  float fVar116;
  float fVar117;
  undefined1 auVar114 [16];
  float fVar118;
  float fVar119;
  float fVar120;
  float fVar121;
  float fVar124;
  float fVar125;
  float fVar126;
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  float fVar127;
  float fVar128;
  float fVar129;
  float fVar130;
  float fVar133;
  float fVar134;
  float fVar135;
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  float fVar136;
  float fVar137;
  float fVar138;
  float fVar139;
  float fVar140;
  float fVar142;
  float fVar143;
  float fVar144;
  float fVar145;
  float fVar146;
  float fVar147;
  undefined1 auVar141 [16];
  float fVar148;
  float fVar149;
  float fVar150;
  UVIdentity<4> mapUV;
  Scene *scene;
  vbool<4> valid;
  RTCFilterFunctionNArguments args;
  vfloat<8> tNear;
  StackItemT<embree::NodeRefPtr<8>_> stack [564];
  RayHitK<4> local_27d9;
  ulong local_27d8;
  size_t local_27d0;
  RayHitK<4> *local_27c8;
  undefined1 local_27c0 [16];
  undefined1 local_27b0 [16];
  undefined1 local_27a0 [16];
  Scene *local_2788;
  undefined1 local_2780 [16];
  undefined1 local_2770 [16];
  undefined1 local_2760 [16];
  undefined1 local_2750 [16];
  undefined1 local_2740 [16];
  undefined1 local_2730 [16];
  undefined1 local_2720 [16];
  undefined1 local_2710 [16];
  undefined1 local_2700 [16];
  undefined1 local_26f0 [16];
  undefined1 local_26e0 [16];
  undefined1 (*local_26c8) [16];
  ulong local_26c0;
  long local_26b8;
  long local_26b0;
  ulong local_26a8;
  undefined1 *local_26a0;
  void *local_2698;
  RTCRayQueryContext *local_2690;
  RayHitK<4> *local_2688;
  undefined1 (*local_2680) [16];
  undefined4 local_2678;
  undefined8 local_2670;
  undefined8 uStack_2668;
  undefined1 local_2660 [32];
  undefined1 local_2640 [16];
  RayHitK<4> *local_2630;
  undefined1 local_2620 [16];
  undefined1 local_2610 [16];
  undefined1 local_2600 [16];
  undefined1 local_25f0 [16];
  undefined1 local_25e0 [16];
  undefined1 local_25d0 [16];
  undefined1 local_25c0 [2] [16];
  undefined1 local_25a0 [32];
  undefined1 local_2580 [16];
  undefined1 local_2570 [16];
  undefined8 local_2560;
  undefined8 uStack_2558;
  undefined1 local_2550 [16];
  undefined1 local_2540 [16];
  undefined1 local_2530 [16];
  undefined1 local_2520 [16];
  undefined4 local_2510;
  undefined4 uStack_250c;
  undefined4 uStack_2508;
  undefined4 uStack_2504;
  undefined4 local_2500;
  undefined4 uStack_24fc;
  undefined4 uStack_24f8;
  undefined4 uStack_24f4;
  uint local_24f0;
  uint uStack_24ec;
  uint uStack_24e8;
  uint uStack_24e4;
  uint local_24e0;
  uint uStack_24dc;
  uint uStack_24d8;
  uint uStack_24d4;
  uint uStack_24d0;
  uint uStack_24cc;
  uint uStack_24c8;
  uint uStack_24c4;
  float local_24c0;
  float fStack_24bc;
  float fStack_24b8;
  float fStack_24b4;
  float fStack_24b0;
  float fStack_24ac;
  float fStack_24a8;
  float fStack_24a4;
  float local_24a0;
  float fStack_249c;
  float fStack_2498;
  float fStack_2494;
  float fStack_2490;
  float fStack_248c;
  float fStack_2488;
  float fStack_2484;
  float local_2480;
  float fStack_247c;
  float fStack_2478;
  float fStack_2474;
  float fStack_2470;
  float fStack_246c;
  float fStack_2468;
  float fStack_2464;
  float local_2460;
  float fStack_245c;
  float fStack_2458;
  float fStack_2454;
  float fStack_2450;
  float fStack_244c;
  float fStack_2448;
  float fStack_2444;
  float local_2440;
  float fStack_243c;
  float fStack_2438;
  float fStack_2434;
  float fStack_2430;
  float fStack_242c;
  float fStack_2428;
  float fStack_2424;
  float local_2420;
  float fStack_241c;
  float fStack_2418;
  float fStack_2414;
  float fStack_2410;
  float fStack_240c;
  float fStack_2408;
  float fStack_2404;
  undefined1 local_2400 [32];
  undefined1 local_23e0 [32];
  undefined1 local_23c0 [32];
  size_t local_23a0;
  undefined4 uStack_2398;
  undefined1 local_2390 [48];
  undefined8 local_2360 [1126];
  ulong uVar19;
  
  pauVar37 = (undefined1 (*) [16])local_2390;
  local_23a0 = root.ptr;
  uStack_2398 = 0;
  uVar14 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4);
  local_23c0._4_4_ = uVar14;
  local_23c0._0_4_ = uVar14;
  local_23c0._8_4_ = uVar14;
  local_23c0._12_4_ = uVar14;
  local_23c0._16_4_ = uVar14;
  local_23c0._20_4_ = uVar14;
  local_23c0._24_4_ = uVar14;
  local_23c0._28_4_ = uVar14;
  auVar93 = ZEXT3264(local_23c0);
  uVar14 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4 + 0x10);
  local_23e0._4_4_ = uVar14;
  local_23e0._0_4_ = uVar14;
  local_23e0._8_4_ = uVar14;
  local_23e0._12_4_ = uVar14;
  local_23e0._16_4_ = uVar14;
  local_23e0._20_4_ = uVar14;
  local_23e0._24_4_ = uVar14;
  local_23e0._28_4_ = uVar14;
  auVar94 = ZEXT3264(local_23e0);
  uVar14 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4 + 0x20);
  local_2400._4_4_ = uVar14;
  local_2400._0_4_ = uVar14;
  local_2400._8_4_ = uVar14;
  local_2400._12_4_ = uVar14;
  local_2400._16_4_ = uVar14;
  local_2400._20_4_ = uVar14;
  local_2400._24_4_ = uVar14;
  local_2400._28_4_ = uVar14;
  auVar101 = ZEXT3264(local_2400);
  fVar121 = *(float *)((long)&(tray->rdir).field_0 + k * 4);
  fVar130 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x10);
  fVar139 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x20);
  fVar102 = fVar121 * 0.99999964;
  fVar110 = fVar130 * 0.99999964;
  fVar113 = fVar139 * 0.99999964;
  fVar121 = fVar121 * 1.0000004;
  fVar130 = fVar130 * 1.0000004;
  fVar139 = fVar139 * 1.0000004;
  uVar32 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4);
  uVar25 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x10);
  local_26a8 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x20);
  uVar36 = uVar32 ^ 0x20;
  uVar38 = uVar25 ^ 0x20;
  iVar2 = (tray->tnear).field_0.i[k];
  local_25a0._4_4_ = iVar2;
  local_25a0._0_4_ = iVar2;
  local_25a0._8_4_ = iVar2;
  local_25a0._12_4_ = iVar2;
  local_25a0._16_4_ = iVar2;
  local_25a0._20_4_ = iVar2;
  local_25a0._24_4_ = iVar2;
  local_25a0._28_4_ = iVar2;
  auVar86 = ZEXT3264(local_25a0);
  iVar2 = (tray->tfar).field_0.i[k];
  auVar47 = ZEXT3264(CONCAT428(iVar2,CONCAT424(iVar2,CONCAT420(iVar2,CONCAT416(iVar2,CONCAT412(iVar2
                                                  ,CONCAT48(iVar2,CONCAT44(iVar2,iVar2))))))));
  uVar35 = local_26a8 ^ 0x20;
  local_26c8 = (undefined1 (*) [16])(mm_lookupmask_ps + (long)(1 << ((uint)k & 0x1f)) * 0x10);
  local_2420 = fVar102;
  fStack_241c = fVar102;
  fStack_2418 = fVar102;
  fStack_2414 = fVar102;
  fStack_2410 = fVar102;
  fStack_240c = fVar102;
  fStack_2408 = fVar102;
  fStack_2404 = fVar102;
  local_2440 = fVar110;
  fStack_243c = fVar110;
  fStack_2438 = fVar110;
  fStack_2434 = fVar110;
  fStack_2430 = fVar110;
  fStack_242c = fVar110;
  fStack_2428 = fVar110;
  fStack_2424 = fVar110;
  local_2460 = fVar113;
  fStack_245c = fVar113;
  fStack_2458 = fVar113;
  fStack_2454 = fVar113;
  fStack_2450 = fVar113;
  fStack_244c = fVar113;
  fStack_2448 = fVar113;
  fStack_2444 = fVar113;
  local_2480 = fVar121;
  fStack_247c = fVar121;
  fStack_2478 = fVar121;
  fStack_2474 = fVar121;
  fStack_2470 = fVar121;
  fStack_246c = fVar121;
  fStack_2468 = fVar121;
  fStack_2464 = fVar121;
  local_24a0 = fVar130;
  fStack_249c = fVar130;
  fStack_2498 = fVar130;
  fStack_2494 = fVar130;
  fStack_2490 = fVar130;
  fStack_248c = fVar130;
  fStack_2488 = fVar130;
  fStack_2484 = fVar130;
  local_24c0 = fVar139;
  fStack_24bc = fVar139;
  fStack_24b8 = fVar139;
  fStack_24b4 = fVar139;
  fStack_24b0 = fVar139;
  fStack_24ac = fVar139;
  fStack_24a8 = fVar139;
  fStack_24a4 = fVar139;
  fVar104 = fVar102;
  fVar105 = fVar102;
  fVar106 = fVar102;
  fVar107 = fVar102;
  fVar108 = fVar102;
  fVar109 = fVar102;
  fVar111 = fVar110;
  fVar140 = fVar110;
  fVar143 = fVar110;
  fVar145 = fVar110;
  fVar147 = fVar110;
  fVar112 = fVar110;
  fVar115 = fVar113;
  fVar116 = fVar113;
  fVar117 = fVar113;
  fVar118 = fVar113;
  fVar119 = fVar113;
  fVar120 = fVar113;
  fVar124 = fVar121;
  fVar125 = fVar121;
  fVar126 = fVar121;
  fVar127 = fVar121;
  fVar128 = fVar121;
  fVar129 = fVar121;
  fVar133 = fVar130;
  fVar134 = fVar130;
  fVar135 = fVar130;
  fVar136 = fVar130;
  fVar137 = fVar130;
  fVar138 = fVar130;
  fVar142 = fVar139;
  fVar144 = fVar139;
  fVar146 = fVar139;
  fVar148 = fVar139;
  fVar149 = fVar139;
  fVar150 = fVar139;
  local_27d8 = uVar25;
  local_27d0 = k;
  local_27c8 = ray;
  local_26c0 = uVar32;
LAB_016662ad:
  do {
    do {
      if (pauVar37 == (undefined1 (*) [16])&local_23a0) {
        return;
      }
      pauVar21 = pauVar37 + -1;
      pauVar37 = pauVar37 + -1;
    } while (*(float *)(ray + k * 4 + 0x80) < *(float *)(*pauVar21 + 8));
    uVar22 = *(ulong *)*pauVar37;
    while ((uVar22 & 8) == 0) {
      uVar14 = *(undefined4 *)(ray + k * 4 + 0x70);
      auVar57._4_4_ = uVar14;
      auVar57._0_4_ = uVar14;
      auVar57._8_4_ = uVar14;
      auVar57._12_4_ = uVar14;
      auVar57._16_4_ = uVar14;
      auVar57._20_4_ = uVar14;
      auVar57._24_4_ = uVar14;
      auVar57._28_4_ = uVar14;
      uVar15 = uVar22 & 0xfffffffffffffff0;
      auVar48 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar15 + 0x100 + uVar32),auVar57,
                                *(undefined1 (*) [32])(uVar15 + 0x40 + uVar32));
      auVar7 = vsubps_avx(ZEXT1632(auVar48),auVar93._0_32_);
      auVar8._4_4_ = fVar104 * auVar7._4_4_;
      auVar8._0_4_ = fVar102 * auVar7._0_4_;
      auVar8._8_4_ = fVar105 * auVar7._8_4_;
      auVar8._12_4_ = fVar106 * auVar7._12_4_;
      auVar8._16_4_ = fVar107 * auVar7._16_4_;
      auVar8._20_4_ = fVar108 * auVar7._20_4_;
      auVar8._24_4_ = fVar109 * auVar7._24_4_;
      auVar8._28_4_ = auVar7._28_4_;
      auVar7 = vmaxps_avx(auVar86._0_32_,auVar8);
      auVar48 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar15 + 0x100 + uVar25),auVar57,
                                *(undefined1 (*) [32])(uVar15 + 0x40 + uVar25));
      auVar8 = vsubps_avx(ZEXT1632(auVar48),auVar94._0_32_);
      auVar6._4_4_ = fVar111 * auVar8._4_4_;
      auVar6._0_4_ = fVar110 * auVar8._0_4_;
      auVar6._8_4_ = fVar140 * auVar8._8_4_;
      auVar6._12_4_ = fVar143 * auVar8._12_4_;
      auVar6._16_4_ = fVar145 * auVar8._16_4_;
      auVar6._20_4_ = fVar147 * auVar8._20_4_;
      auVar6._24_4_ = fVar112 * auVar8._24_4_;
      auVar6._28_4_ = auVar8._28_4_;
      auVar48 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar15 + 0x100 + local_26a8),auVar57,
                                *(undefined1 (*) [32])(uVar15 + 0x40 + local_26a8));
      auVar8 = vsubps_avx(ZEXT1632(auVar48),auVar101._0_32_);
      auVar10._4_4_ = fVar115 * auVar8._4_4_;
      auVar10._0_4_ = fVar113 * auVar8._0_4_;
      auVar10._8_4_ = fVar116 * auVar8._8_4_;
      auVar10._12_4_ = fVar117 * auVar8._12_4_;
      auVar10._16_4_ = fVar118 * auVar8._16_4_;
      auVar10._20_4_ = fVar119 * auVar8._20_4_;
      auVar10._24_4_ = fVar120 * auVar8._24_4_;
      auVar10._28_4_ = auVar8._28_4_;
      auVar8 = vmaxps_avx(auVar6,auVar10);
      local_2660 = vmaxps_avx(auVar7,auVar8);
      auVar48 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar15 + 0x100 + uVar36),auVar57,
                                *(undefined1 (*) [32])(uVar15 + 0x40 + uVar36));
      auVar7 = vsubps_avx(ZEXT1632(auVar48),auVar93._0_32_);
      auVar11._4_4_ = fVar124 * auVar7._4_4_;
      auVar11._0_4_ = fVar121 * auVar7._0_4_;
      auVar11._8_4_ = fVar125 * auVar7._8_4_;
      auVar11._12_4_ = fVar126 * auVar7._12_4_;
      auVar11._16_4_ = fVar127 * auVar7._16_4_;
      auVar11._20_4_ = fVar128 * auVar7._20_4_;
      auVar11._24_4_ = fVar129 * auVar7._24_4_;
      auVar11._28_4_ = auVar7._28_4_;
      auVar7 = vminps_avx(auVar47._0_32_,auVar11);
      auVar48 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar15 + 0x100 + uVar38),auVar57,
                                *(undefined1 (*) [32])(uVar15 + 0x40 + uVar38));
      auVar8 = vsubps_avx(ZEXT1632(auVar48),auVar94._0_32_);
      auVar48 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar15 + 0x100 + uVar35),auVar57,
                                *(undefined1 (*) [32])(uVar15 + 0x40 + uVar35));
      auVar12._4_4_ = fVar133 * auVar8._4_4_;
      auVar12._0_4_ = fVar130 * auVar8._0_4_;
      auVar12._8_4_ = fVar134 * auVar8._8_4_;
      auVar12._12_4_ = fVar135 * auVar8._12_4_;
      auVar12._16_4_ = fVar136 * auVar8._16_4_;
      auVar12._20_4_ = fVar137 * auVar8._20_4_;
      auVar12._24_4_ = fVar138 * auVar8._24_4_;
      auVar12._28_4_ = auVar8._28_4_;
      auVar8 = vsubps_avx(ZEXT1632(auVar48),auVar101._0_32_);
      auVar13._4_4_ = fVar142 * auVar8._4_4_;
      auVar13._0_4_ = fVar139 * auVar8._0_4_;
      auVar13._8_4_ = fVar144 * auVar8._8_4_;
      auVar13._12_4_ = fVar146 * auVar8._12_4_;
      auVar13._16_4_ = fVar148 * auVar8._16_4_;
      auVar13._20_4_ = fVar149 * auVar8._20_4_;
      auVar13._24_4_ = fVar150 * auVar8._24_4_;
      auVar13._28_4_ = auVar8._28_4_;
      auVar8 = vminps_avx(auVar12,auVar13);
      auVar7 = vminps_avx(auVar7,auVar8);
      auVar7 = vcmpps_avx(local_2660,auVar7,2);
      if (((uint)uVar22 & 7) == 6) {
        auVar8 = vcmpps_avx(*(undefined1 (*) [32])(uVar15 + 0x1c0),auVar57,2);
        auVar6 = vcmpps_avx(auVar57,*(undefined1 (*) [32])(uVar15 + 0x1e0),1);
        auVar8 = vandps_avx(auVar8,auVar6);
        auVar7 = vandps_avx(auVar8,auVar7);
        auVar48 = vpackssdw_avx(auVar7._0_16_,auVar7._16_16_);
      }
      else {
        auVar48 = vpackssdw_avx(auVar7._0_16_,auVar7._16_16_);
      }
      auVar48 = vpsllw_avx(auVar48,0xf);
      if ((((((((auVar48 >> 0xf & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
               (auVar48 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
              (auVar48 >> 0x2f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
             (auVar48 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
            (auVar48 >> 0x4f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
           (auVar48 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
          (auVar48 >> 0x6f & (undefined1  [16])0x1) == (undefined1  [16])0x0) && -1 < auVar48[0xf])
      goto LAB_016662ad;
      auVar48 = vpacksswb_avx(auVar48,auVar48);
      bVar9 = SUB161(auVar48 >> 7,0) & 1 | (SUB161(auVar48 >> 0xf,0) & 1) << 1 |
              (SUB161(auVar48 >> 0x17,0) & 1) << 2 | (SUB161(auVar48 >> 0x1f,0) & 1) << 3 |
              (SUB161(auVar48 >> 0x27,0) & 1) << 4 | (SUB161(auVar48 >> 0x2f,0) & 1) << 5 |
              (SUB161(auVar48 >> 0x37,0) & 1) << 6 | SUB161(auVar48 >> 0x3f,0) << 7;
      lVar16 = 0;
      for (uVar22 = (ulong)bVar9; (uVar22 & 1) == 0; uVar22 = uVar22 >> 1 | 0x8000000000000000) {
        lVar16 = lVar16 + 1;
      }
      uVar22 = *(ulong *)(uVar15 + lVar16 * 8);
      uVar18 = bVar9 - 1 & (uint)bVar9;
      uVar19 = (ulong)uVar18;
      if (uVar18 != 0) {
        uVar4 = *(uint *)(local_2660 + lVar16 * 4);
        lVar16 = 0;
        for (; (uVar19 & 1) == 0; uVar19 = uVar19 >> 1 | 0x8000000000000000) {
          lVar16 = lVar16 + 1;
        }
        uVar18 = uVar18 - 1 & uVar18;
        uVar20 = (ulong)uVar18;
        uVar19 = *(ulong *)(uVar15 + lVar16 * 8);
        uVar5 = *(uint *)(local_2660 + lVar16 * 4);
        uVar25 = local_27d8;
        if (uVar18 == 0) {
          if (uVar4 < uVar5) {
            *(ulong *)*pauVar37 = uVar19;
            *(uint *)(*pauVar37 + 8) = uVar5;
            pauVar37 = pauVar37 + 1;
          }
          else {
            *(ulong *)*pauVar37 = uVar22;
            *(uint *)(*pauVar37 + 8) = uVar4;
            uVar22 = uVar19;
            pauVar37 = pauVar37 + 1;
          }
        }
        else {
          auVar48._8_8_ = 0;
          auVar48._0_8_ = uVar22;
          auVar48 = vpunpcklqdq_avx(auVar48,ZEXT416(uVar4));
          auVar58._8_8_ = 0;
          auVar58._0_8_ = uVar19;
          auVar58 = vpunpcklqdq_avx(auVar58,ZEXT416(uVar5));
          lVar16 = 0;
          for (; (uVar20 & 1) == 0; uVar20 = uVar20 >> 1 | 0x8000000000000000) {
            lVar16 = lVar16 + 1;
          }
          uVar18 = uVar18 - 1 & uVar18;
          uVar22 = (ulong)uVar18;
          auVar62._8_8_ = 0;
          auVar62._0_8_ = *(ulong *)(uVar15 + lVar16 * 8);
          auVar49 = vpunpcklqdq_avx(auVar62,ZEXT416(*(uint *)(local_2660 + lVar16 * 4)));
          auVar62 = vpcmpgtd_avx(auVar58,auVar48);
          if (uVar18 == 0) {
            auVar73 = vpshufd_avx(auVar62,0xaa);
            auVar62 = vblendvps_avx(auVar58,auVar48,auVar73);
            auVar48 = vblendvps_avx(auVar48,auVar58,auVar73);
            auVar58 = vpcmpgtd_avx(auVar49,auVar62);
            auVar73 = vpshufd_avx(auVar58,0xaa);
            auVar58 = vblendvps_avx(auVar49,auVar62,auVar73);
            auVar62 = vblendvps_avx(auVar62,auVar49,auVar73);
            auVar49 = vpcmpgtd_avx(auVar62,auVar48);
            auVar73 = vpshufd_avx(auVar49,0xaa);
            auVar49 = vblendvps_avx(auVar62,auVar48,auVar73);
            auVar48 = vblendvps_avx(auVar48,auVar62,auVar73);
            *pauVar37 = auVar48;
            pauVar37[1] = auVar49;
            uVar22 = auVar58._0_8_;
            pauVar37 = pauVar37 + 2;
          }
          else {
            lVar16 = 0;
            for (; (uVar22 & 1) == 0; uVar22 = uVar22 >> 1 | 0x8000000000000000) {
              lVar16 = lVar16 + 1;
            }
            uVar18 = uVar18 - 1 & uVar18;
            uVar22 = (ulong)uVar18;
            auVar73._8_8_ = 0;
            auVar73._0_8_ = *(ulong *)(uVar15 + lVar16 * 8);
            auVar73 = vpunpcklqdq_avx(auVar73,ZEXT416(*(uint *)(local_2660 + lVar16 * 4)));
            if (uVar18 == 0) {
              auVar52 = vpshufd_avx(auVar62,0xaa);
              auVar62 = vblendvps_avx(auVar58,auVar48,auVar52);
              auVar48 = vblendvps_avx(auVar48,auVar58,auVar52);
              auVar58 = vpcmpgtd_avx(auVar73,auVar49);
              auVar52 = vpshufd_avx(auVar58,0xaa);
              auVar58 = vblendvps_avx(auVar73,auVar49,auVar52);
              auVar49 = vblendvps_avx(auVar49,auVar73,auVar52);
              auVar73 = vpcmpgtd_avx(auVar49,auVar48);
              auVar52 = vpshufd_avx(auVar73,0xaa);
              auVar73 = vblendvps_avx(auVar49,auVar48,auVar52);
              auVar48 = vblendvps_avx(auVar48,auVar49,auVar52);
              auVar49 = vpcmpgtd_avx(auVar58,auVar62);
              auVar52 = vpshufd_avx(auVar49,0xaa);
              auVar49 = vblendvps_avx(auVar58,auVar62,auVar52);
              auVar58 = vblendvps_avx(auVar62,auVar58,auVar52);
              auVar62 = vpcmpgtd_avx(auVar73,auVar58);
              auVar52 = vpshufd_avx(auVar62,0xaa);
              auVar62 = vblendvps_avx(auVar73,auVar58,auVar52);
              auVar58 = vblendvps_avx(auVar58,auVar73,auVar52);
              *pauVar37 = auVar48;
              pauVar37[1] = auVar58;
              pauVar37[2] = auVar62;
              uVar22 = auVar49._0_8_;
              pauVar21 = pauVar37 + 3;
            }
            else {
              *pauVar37 = auVar48;
              pauVar37[1] = auVar58;
              pauVar37[2] = auVar49;
              pauVar21 = pauVar37 + 3;
              pauVar37[3] = auVar73;
              do {
                lVar16 = 0;
                for (uVar19 = uVar22; (uVar19 & 1) == 0; uVar19 = uVar19 >> 1 | 0x8000000000000000)
                {
                  lVar16 = lVar16 + 1;
                }
                auVar49._8_8_ = 0;
                auVar49._0_8_ = *(ulong *)(uVar15 + lVar16 * 8);
                auVar48 = vpunpcklqdq_avx(auVar49,ZEXT416(*(uint *)(local_2660 + lVar16 * 4)));
                pauVar21[1] = auVar48;
                pauVar21 = pauVar21 + 1;
                uVar22 = uVar22 - 1 & uVar22;
              } while (uVar22 != 0);
              lVar16 = 0;
              while (pauVar21 != pauVar37) {
                auVar48 = pauVar37[1];
                uVar18 = vextractps_avx(auVar48,2);
                for (lVar23 = 0x10;
                    (lVar16 != lVar23 && (*(uint *)(pauVar37[-1] + lVar23 + 8) < uVar18));
                    lVar23 = lVar23 + -0x10) {
                  *(undefined1 (*) [16])(*pauVar37 + lVar23) =
                       *(undefined1 (*) [16])(pauVar37[-1] + lVar23);
                }
                *(undefined1 (*) [16])(*pauVar37 + lVar23) = auVar48;
                lVar16 = lVar16 + -0x10;
                pauVar37 = pauVar37 + 1;
              }
              uVar22 = *(ulong *)*pauVar21;
              k = local_27d0;
              ray = local_27c8;
            }
            auVar86 = ZEXT3264(local_25a0);
            pauVar37 = pauVar21;
          }
        }
      }
    }
    local_26b8 = (ulong)((uint)uVar22 & 0xf) - 8;
    uVar22 = uVar22 & 0xfffffffffffffff0;
    for (local_26b0 = 0; local_26b0 != local_26b8; local_26b0 = local_26b0 + 1) {
      lVar33 = local_26b0 * 0x50;
      pSVar24 = context->scene;
      pGVar34 = (pSVar24->geometries).items[*(uint *)(uVar22 + 0x30 + lVar33)].ptr;
      fVar121 = (pGVar34->time_range).lower;
      fVar121 = pGVar34->fnumTimeSegments *
                ((*(float *)(ray + k * 4 + 0x70) - fVar121) /
                ((pGVar34->time_range).upper - fVar121));
      auVar48 = vroundss_avx(ZEXT416((uint)fVar121),ZEXT416((uint)fVar121),9);
      auVar48 = vminss_avx(auVar48,ZEXT416((uint)(pGVar34->fnumTimeSegments + -1.0)));
      auVar59 = vmaxss_avx(ZEXT816(0),auVar48);
      lVar23 = (long)(int)auVar59._0_4_ * 0x38;
      uVar31 = (ulong)*(uint *)(uVar22 + 4 + lVar33);
      lVar16 = *(long *)(*(long *)&pGVar34[2].numPrimitives + lVar23);
      lVar23 = *(long *)(*(long *)&pGVar34[2].numPrimitives + 0x38 + lVar23);
      auVar48 = *(undefined1 (*) [16])(lVar16 + (ulong)*(uint *)(uVar22 + lVar33) * 4);
      uVar19 = (ulong)*(uint *)(uVar22 + 0x10 + lVar33);
      auVar58 = *(undefined1 (*) [16])(lVar16 + uVar19 * 4);
      uVar20 = (ulong)*(uint *)(uVar22 + 0x20 + lVar33);
      auVar65 = *(undefined1 (*) [16])(lVar16 + uVar20 * 4);
      auVar62 = *(undefined1 (*) [16])(lVar16 + uVar31 * 4);
      uVar26 = (ulong)*(uint *)(uVar22 + 0x14 + lVar33);
      auVar49 = *(undefined1 (*) [16])(lVar16 + uVar26 * 4);
      uVar27 = (ulong)*(uint *)(uVar22 + 0x24 + lVar33);
      auVar67 = *(undefined1 (*) [16])(lVar16 + uVar27 * 4);
      uVar28 = (ulong)*(uint *)(uVar22 + 8 + lVar33);
      auVar73 = *(undefined1 (*) [16])(lVar16 + uVar28 * 4);
      uVar25 = (ulong)*(uint *)(uVar22 + 0x18 + lVar33);
      auVar52 = *(undefined1 (*) [16])(lVar16 + uVar25 * 4);
      uVar29 = (ulong)*(uint *)(uVar22 + 0x28 + lVar33);
      auVar50 = *(undefined1 (*) [16])(lVar16 + uVar29 * 4);
      uVar30 = (ulong)*(uint *)(uVar22 + 0xc + lVar33);
      auVar42 = *(undefined1 (*) [16])(lVar16 + uVar30 * 4);
      uVar32 = (ulong)*(uint *)(uVar22 + 0x1c + lVar33);
      auVar40 = *(undefined1 (*) [16])(lVar16 + uVar32 * 4);
      uVar15 = (ulong)*(uint *)(uVar22 + 0x2c + lVar33);
      auVar39 = *(undefined1 (*) [16])(lVar16 + uVar15 * 4);
      auVar41 = *(undefined1 (*) [16])(lVar23 + (ulong)*(uint *)(uVar22 + lVar33) * 4);
      auVar51 = *(undefined1 (*) [16])(lVar23 + uVar19 * 4);
      fVar121 = fVar121 - auVar59._0_4_;
      auVar59 = vunpcklps_avx(auVar48,auVar73);
      auVar73 = vunpckhps_avx(auVar48,auVar73);
      auVar60 = vunpcklps_avx(auVar62,auVar42);
      auVar62 = vunpckhps_avx(auVar62,auVar42);
      auVar48 = *(undefined1 (*) [16])(lVar23 + uVar31 * 4);
      auVar63 = vunpcklps_avx(auVar73,auVar62);
      auVar64 = vunpcklps_avx(auVar59,auVar60);
      auVar73 = vunpckhps_avx(auVar59,auVar60);
      auVar42 = vunpcklps_avx(auVar58,auVar52);
      auVar62 = vunpckhps_avx(auVar58,auVar52);
      auVar52 = vunpcklps_avx(auVar49,auVar40);
      auVar49 = vunpckhps_avx(auVar49,auVar40);
      auVar58 = *(undefined1 (*) [16])(lVar23 + uVar28 * 4);
      auVar40 = vunpcklps_avx(auVar62,auVar49);
      auVar59 = vunpcklps_avx(auVar42,auVar52);
      auVar49 = vunpckhps_avx(auVar42,auVar52);
      auVar42 = vunpcklps_avx(auVar65,auVar50);
      auVar52 = vunpckhps_avx(auVar65,auVar50);
      auVar60 = vunpcklps_avx(auVar67,auVar39);
      auVar50 = vunpckhps_avx(auVar67,auVar39);
      auVar62 = *(undefined1 (*) [16])(lVar23 + uVar30 * 4);
      auVar39 = vunpcklps_avx(auVar52,auVar50);
      auVar65 = vunpcklps_avx(auVar42,auVar60);
      auVar52 = vunpckhps_avx(auVar42,auVar60);
      auVar50 = vunpcklps_avx(auVar41,auVar58);
      auVar58 = vunpckhps_avx(auVar41,auVar58);
      auVar42 = vunpcklps_avx(auVar48,auVar62);
      auVar62 = vunpckhps_avx(auVar48,auVar62);
      auVar48 = *(undefined1 (*) [16])(lVar23 + uVar25 * 4);
      auVar41 = vunpcklps_avx(auVar58,auVar62);
      auVar60 = vunpcklps_avx(auVar50,auVar42);
      auVar62 = vunpckhps_avx(auVar50,auVar42);
      auVar42 = vunpcklps_avx(auVar51,auVar48);
      auVar50 = vunpckhps_avx(auVar51,auVar48);
      auVar48 = *(undefined1 (*) [16])(lVar23 + uVar26 * 4);
      auVar58 = *(undefined1 (*) [16])(lVar23 + uVar32 * 4);
      auVar51 = vunpcklps_avx(auVar48,auVar58);
      auVar48 = vunpckhps_avx(auVar48,auVar58);
      auVar67 = vunpcklps_avx(auVar50,auVar48);
      auVar66 = vunpcklps_avx(auVar42,auVar51);
      auVar50 = vunpckhps_avx(auVar42,auVar51);
      auVar48 = *(undefined1 (*) [16])(lVar23 + uVar20 * 4);
      auVar58 = *(undefined1 (*) [16])(lVar23 + uVar29 * 4);
      auVar51 = vunpcklps_avx(auVar48,auVar58);
      auVar42 = vunpckhps_avx(auVar48,auVar58);
      auVar48 = *(undefined1 (*) [16])(lVar23 + uVar27 * 4);
      auVar58 = *(undefined1 (*) [16])(lVar23 + uVar15 * 4);
      auVar68 = vunpcklps_avx(auVar48,auVar58);
      auVar48 = vunpckhps_avx(auVar48,auVar58);
      auVar58 = vunpcklps_avx(auVar42,auVar48);
      auVar42 = vunpcklps_avx(auVar51,auVar68);
      auVar48 = vunpckhps_avx(auVar51,auVar68);
      fVar130 = 1.0 - fVar121;
      auVar114._4_4_ = fVar130;
      auVar114._0_4_ = fVar130;
      auVar114._8_4_ = fVar130;
      auVar114._12_4_ = fVar130;
      auVar78._0_4_ = fVar121 * auVar60._0_4_;
      auVar78._4_4_ = fVar121 * auVar60._4_4_;
      auVar78._8_4_ = fVar121 * auVar60._8_4_;
      auVar78._12_4_ = fVar121 * auVar60._12_4_;
      auVar51 = vfmadd231ps_fma(auVar78,auVar114,auVar64);
      auVar95._0_4_ = fVar121 * auVar62._0_4_;
      auVar95._4_4_ = fVar121 * auVar62._4_4_;
      auVar95._8_4_ = fVar121 * auVar62._8_4_;
      auVar95._12_4_ = fVar121 * auVar62._12_4_;
      auVar62 = vfmadd231ps_fma(auVar95,auVar114,auVar73);
      auVar87._0_4_ = fVar121 * auVar41._0_4_;
      auVar87._4_4_ = fVar121 * auVar41._4_4_;
      auVar87._8_4_ = fVar121 * auVar41._8_4_;
      auVar87._12_4_ = fVar121 * auVar41._12_4_;
      auVar73 = vfmadd231ps_fma(auVar87,auVar114,auVar63);
      auVar74._0_4_ = fVar121 * auVar66._0_4_;
      auVar74._4_4_ = fVar121 * auVar66._4_4_;
      auVar74._8_4_ = fVar121 * auVar66._8_4_;
      auVar74._12_4_ = fVar121 * auVar66._12_4_;
      auVar41 = vfmadd231ps_fma(auVar74,auVar114,auVar59);
      auVar66._0_4_ = fVar121 * auVar50._0_4_;
      auVar66._4_4_ = fVar121 * auVar50._4_4_;
      auVar66._8_4_ = fVar121 * auVar50._8_4_;
      auVar66._12_4_ = fVar121 * auVar50._12_4_;
      auVar49 = vfmadd231ps_fma(auVar66,auVar114,auVar49);
      puVar1 = (undefined8 *)(uVar22 + 0x30 + lVar33);
      local_2560 = *puVar1;
      uStack_2558 = puVar1[1];
      puVar1 = (undefined8 *)(uVar22 + 0x40 + lVar33);
      auVar50._0_4_ = fVar121 * auVar67._0_4_;
      auVar50._4_4_ = fVar121 * auVar67._4_4_;
      auVar50._8_4_ = fVar121 * auVar67._8_4_;
      auVar50._12_4_ = fVar121 * auVar67._12_4_;
      auVar50 = vfmadd231ps_fma(auVar50,auVar114,auVar40);
      auVar59._0_4_ = fVar121 * auVar42._0_4_;
      auVar59._4_4_ = fVar121 * auVar42._4_4_;
      auVar59._8_4_ = fVar121 * auVar42._8_4_;
      auVar59._12_4_ = fVar121 * auVar42._12_4_;
      auVar63._0_4_ = fVar121 * auVar48._0_4_;
      auVar63._4_4_ = fVar121 * auVar48._4_4_;
      auVar63._8_4_ = fVar121 * auVar48._8_4_;
      auVar63._12_4_ = fVar121 * auVar48._12_4_;
      auVar103._0_4_ = fVar121 * auVar58._0_4_;
      auVar103._4_4_ = fVar121 * auVar58._4_4_;
      auVar103._8_4_ = fVar121 * auVar58._8_4_;
      auVar103._12_4_ = fVar121 * auVar58._12_4_;
      auVar42 = vfmadd231ps_fma(auVar59,auVar114,auVar65);
      auVar52 = vfmadd231ps_fma(auVar63,auVar114,auVar52);
      auVar40 = vfmadd231ps_fma(auVar103,auVar114,auVar39);
      local_2670 = *puVar1;
      uStack_2668 = puVar1[1];
      uVar14 = *(undefined4 *)(local_27c8 + local_27d0 * 4);
      auVar39._4_4_ = uVar14;
      auVar39._0_4_ = uVar14;
      auVar39._8_4_ = uVar14;
      auVar39._12_4_ = uVar14;
      uVar14 = *(undefined4 *)(local_27c8 + local_27d0 * 4 + 0x10);
      auVar122._4_4_ = uVar14;
      auVar122._0_4_ = uVar14;
      auVar122._8_4_ = uVar14;
      auVar122._12_4_ = uVar14;
      uVar14 = *(undefined4 *)(local_27c8 + local_27d0 * 4 + 0x20);
      auVar131._4_4_ = uVar14;
      auVar131._0_4_ = uVar14;
      auVar131._8_4_ = uVar14;
      auVar131._12_4_ = uVar14;
      local_2760 = vsubps_avx(auVar51,auVar39);
      local_26f0 = vsubps_avx(auVar62,auVar122);
      local_2770 = vsubps_avx(auVar73,auVar131);
      auVar48 = vsubps_avx(auVar41,auVar39);
      auVar58 = vsubps_avx(auVar49,auVar122);
      auVar62 = vsubps_avx(auVar50,auVar131);
      auVar49 = vsubps_avx(auVar42,auVar39);
      auVar73 = vsubps_avx(auVar52,auVar122);
      auVar52 = vsubps_avx(auVar40,auVar131);
      local_2780 = vsubps_avx(auVar49,local_2760);
      local_2710 = vsubps_avx(auVar73,local_26f0);
      local_2700 = vsubps_avx(auVar52,local_2770);
      auVar40._0_4_ = auVar49._0_4_ + local_2760._0_4_;
      auVar40._4_4_ = auVar49._4_4_ + local_2760._4_4_;
      auVar40._8_4_ = auVar49._8_4_ + local_2760._8_4_;
      auVar40._12_4_ = auVar49._12_4_ + local_2760._12_4_;
      auVar64._0_4_ = auVar73._0_4_ + local_26f0._0_4_;
      auVar64._4_4_ = auVar73._4_4_ + local_26f0._4_4_;
      auVar64._8_4_ = auVar73._8_4_ + local_26f0._8_4_;
      auVar64._12_4_ = auVar73._12_4_ + local_26f0._12_4_;
      fVar130 = local_2770._0_4_;
      auVar67._0_4_ = auVar52._0_4_ + fVar130;
      fVar139 = local_2770._4_4_;
      auVar67._4_4_ = auVar52._4_4_ + fVar139;
      fVar102 = local_2770._8_4_;
      auVar67._8_4_ = auVar52._8_4_ + fVar102;
      fVar110 = local_2770._12_4_;
      auVar67._12_4_ = auVar52._12_4_ + fVar110;
      auVar123._0_4_ = local_2700._0_4_ * auVar64._0_4_;
      auVar123._4_4_ = local_2700._4_4_ * auVar64._4_4_;
      auVar123._8_4_ = local_2700._8_4_ * auVar64._8_4_;
      auVar123._12_4_ = local_2700._12_4_ * auVar64._12_4_;
      auVar42 = vfmsub231ps_fma(auVar123,local_2710,auVar67);
      auVar68._0_4_ = local_2780._0_4_ * auVar67._0_4_;
      auVar68._4_4_ = local_2780._4_4_ * auVar67._4_4_;
      auVar68._8_4_ = local_2780._8_4_ * auVar67._8_4_;
      auVar68._12_4_ = local_2780._12_4_ * auVar67._12_4_;
      auVar50 = vfmsub231ps_fma(auVar68,local_2700,auVar40);
      auVar41._0_4_ = local_2710._0_4_ * auVar40._0_4_;
      auVar41._4_4_ = local_2710._4_4_ * auVar40._4_4_;
      auVar41._8_4_ = local_2710._8_4_ * auVar40._8_4_;
      auVar41._12_4_ = local_2710._12_4_ * auVar40._12_4_;
      auVar40 = vfmsub231ps_fma(auVar41,local_2780,auVar64);
      fVar121 = *(float *)(local_27c8 + local_27d0 * 4 + 0x60);
      auVar60._0_4_ = fVar121 * auVar40._0_4_;
      auVar60._4_4_ = fVar121 * auVar40._4_4_;
      auVar60._8_4_ = fVar121 * auVar40._8_4_;
      auVar60._12_4_ = fVar121 * auVar40._12_4_;
      uVar14 = *(undefined4 *)(local_27c8 + local_27d0 * 4 + 0x50);
      auVar96._4_4_ = uVar14;
      auVar96._0_4_ = uVar14;
      auVar96._8_4_ = uVar14;
      auVar96._12_4_ = uVar14;
      auVar50 = vfmadd231ps_fma(auVar60,auVar96,auVar50);
      uVar14 = *(undefined4 *)(local_27c8 + local_27d0 * 4 + 0x40);
      auVar132._4_4_ = uVar14;
      auVar132._0_4_ = uVar14;
      auVar132._8_4_ = uVar14;
      auVar132._12_4_ = uVar14;
      local_2570 = vfmadd231ps_fma(auVar50,auVar132,auVar42);
      local_2720 = vsubps_avx(local_26f0,auVar58);
      local_2740 = vsubps_avx(local_2770,auVar62);
      auVar65._0_4_ = local_26f0._0_4_ + auVar58._0_4_;
      auVar65._4_4_ = local_26f0._4_4_ + auVar58._4_4_;
      auVar65._8_4_ = local_26f0._8_4_ + auVar58._8_4_;
      auVar65._12_4_ = local_26f0._12_4_ + auVar58._12_4_;
      auVar69._0_4_ = auVar62._0_4_ + fVar130;
      auVar69._4_4_ = auVar62._4_4_ + fVar139;
      auVar69._8_4_ = auVar62._8_4_ + fVar102;
      auVar69._12_4_ = auVar62._12_4_ + fVar110;
      fVar113 = local_2740._0_4_;
      auVar79._0_4_ = auVar65._0_4_ * fVar113;
      fVar105 = local_2740._4_4_;
      auVar79._4_4_ = auVar65._4_4_ * fVar105;
      fVar107 = local_2740._8_4_;
      auVar79._8_4_ = auVar65._8_4_ * fVar107;
      fVar109 = local_2740._12_4_;
      auVar79._12_4_ = auVar65._12_4_ * fVar109;
      auVar42 = vfmsub231ps_fma(auVar79,local_2720,auVar69);
      local_2730 = vsubps_avx(local_2760,auVar48);
      fVar140 = local_2730._0_4_;
      auVar88._0_4_ = fVar140 * auVar69._0_4_;
      fVar143 = local_2730._4_4_;
      auVar88._4_4_ = fVar143 * auVar69._4_4_;
      fVar145 = local_2730._8_4_;
      auVar88._8_4_ = fVar145 * auVar69._8_4_;
      fVar147 = local_2730._12_4_;
      auVar88._12_4_ = fVar147 * auVar69._12_4_;
      auVar70._0_4_ = local_2760._0_4_ + auVar48._0_4_;
      auVar70._4_4_ = local_2760._4_4_ + auVar48._4_4_;
      auVar70._8_4_ = local_2760._8_4_ + auVar48._8_4_;
      auVar70._12_4_ = local_2760._12_4_ + auVar48._12_4_;
      auVar50 = vfmsub231ps_fma(auVar88,local_2740,auVar70);
      fVar104 = local_2720._0_4_;
      auVar71._0_4_ = auVar70._0_4_ * fVar104;
      fVar106 = local_2720._4_4_;
      auVar71._4_4_ = auVar70._4_4_ * fVar106;
      fVar108 = local_2720._8_4_;
      auVar71._8_4_ = auVar70._8_4_ * fVar108;
      fVar111 = local_2720._12_4_;
      auVar71._12_4_ = auVar70._12_4_ * fVar111;
      auVar40 = vfmsub231ps_fma(auVar71,local_2730,auVar65);
      auVar72._0_4_ = fVar121 * auVar40._0_4_;
      auVar72._4_4_ = fVar121 * auVar40._4_4_;
      auVar72._8_4_ = fVar121 * auVar40._8_4_;
      auVar72._12_4_ = fVar121 * auVar40._12_4_;
      auVar50 = vfmadd231ps_fma(auVar72,auVar96,auVar50);
      local_2660._16_16_ = vfmadd231ps_fma(auVar50,auVar132,auVar42);
      auVar50 = vsubps_avx(auVar48,auVar49);
      auVar80._0_4_ = auVar49._0_4_ + auVar48._0_4_;
      auVar80._4_4_ = auVar49._4_4_ + auVar48._4_4_;
      auVar80._8_4_ = auVar49._8_4_ + auVar48._8_4_;
      auVar80._12_4_ = auVar49._12_4_ + auVar48._12_4_;
      auVar49 = vsubps_avx(auVar58,auVar73);
      auVar42._0_4_ = auVar58._0_4_ + auVar73._0_4_;
      auVar42._4_4_ = auVar58._4_4_ + auVar73._4_4_;
      auVar42._8_4_ = auVar58._8_4_ + auVar73._8_4_;
      auVar42._12_4_ = auVar58._12_4_ + auVar73._12_4_;
      auVar73 = vsubps_avx(auVar62,auVar52);
      auVar51._0_4_ = auVar62._0_4_ + auVar52._0_4_;
      auVar51._4_4_ = auVar62._4_4_ + auVar52._4_4_;
      auVar51._8_4_ = auVar62._8_4_ + auVar52._8_4_;
      auVar51._12_4_ = auVar62._12_4_ + auVar52._12_4_;
      auVar89._0_4_ = auVar42._0_4_ * auVar73._0_4_;
      auVar89._4_4_ = auVar42._4_4_ * auVar73._4_4_;
      auVar89._8_4_ = auVar42._8_4_ * auVar73._8_4_;
      auVar89._12_4_ = auVar42._12_4_ * auVar73._12_4_;
      auVar58 = vfmsub231ps_fma(auVar89,auVar49,auVar51);
      auVar52._0_4_ = auVar51._0_4_ * auVar50._0_4_;
      auVar52._4_4_ = auVar51._4_4_ * auVar50._4_4_;
      auVar52._8_4_ = auVar51._8_4_ * auVar50._8_4_;
      auVar52._12_4_ = auVar51._12_4_ * auVar50._12_4_;
      auVar48 = vfmsub231ps_fma(auVar52,auVar73,auVar80);
      auVar81._0_4_ = auVar49._0_4_ * auVar80._0_4_;
      auVar81._4_4_ = auVar49._4_4_ * auVar80._4_4_;
      auVar81._8_4_ = auVar49._8_4_ * auVar80._8_4_;
      auVar81._12_4_ = auVar49._12_4_ * auVar80._12_4_;
      auVar62 = vfmsub231ps_fma(auVar81,auVar50,auVar42);
      auVar82._0_4_ = fVar121 * auVar62._0_4_;
      auVar82._4_4_ = fVar121 * auVar62._4_4_;
      auVar82._8_4_ = fVar121 * auVar62._8_4_;
      auVar82._12_4_ = fVar121 * auVar62._12_4_;
      auVar48 = vfmadd231ps_fma(auVar82,auVar96,auVar48);
      auVar62 = vfmadd231ps_fma(auVar48,auVar132,auVar58);
      local_2640._0_4_ = auVar62._0_4_ + local_2570._0_4_ + local_2660._16_4_;
      local_2640._4_4_ = auVar62._4_4_ + local_2570._4_4_ + local_2660._20_4_;
      local_2640._8_4_ = auVar62._8_4_ + local_2570._8_4_ + local_2660._24_4_;
      local_2640._12_4_ = auVar62._12_4_ + local_2570._12_4_ + local_2660._28_4_;
      auVar141._8_4_ = 0x7fffffff;
      auVar141._0_8_ = 0x7fffffff7fffffff;
      auVar141._12_4_ = 0x7fffffff;
      auVar48 = vminps_avx(local_2570,local_2660._16_16_);
      auVar48 = vminps_avx(auVar48,auVar62);
      local_2580 = vandps_avx(local_2640,auVar141);
      auVar97._0_4_ = local_2580._0_4_ * 1.1920929e-07;
      auVar97._4_4_ = local_2580._4_4_ * 1.1920929e-07;
      auVar97._8_4_ = local_2580._8_4_ * 1.1920929e-07;
      auVar97._12_4_ = local_2580._12_4_ * 1.1920929e-07;
      uVar25 = CONCAT44(auVar97._4_4_,auVar97._0_4_);
      auVar90._0_8_ = uVar25 ^ 0x8000000080000000;
      auVar90._8_4_ = -auVar97._8_4_;
      auVar90._12_4_ = -auVar97._12_4_;
      auVar48 = vcmpps_avx(auVar48,auVar90,5);
      auVar58 = vmaxps_avx(local_2570,local_2660._16_16_);
      auVar58 = vmaxps_avx(auVar58,auVar62);
      auVar58 = vcmpps_avx(auVar58,auVar97,2);
      local_27c0 = vorps_avx(auVar48,auVar58);
      k = local_27d0;
      ray = local_27c8;
      if ((((local_27c0 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
           (local_27c0 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
          (local_27c0 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
          local_27c0[0xf] < '\0') {
        auVar53._0_4_ = fVar104 * local_2700._0_4_;
        auVar53._4_4_ = fVar106 * local_2700._4_4_;
        auVar53._8_4_ = fVar108 * local_2700._8_4_;
        auVar53._12_4_ = fVar111 * local_2700._12_4_;
        auVar83._0_4_ = fVar140 * local_2710._0_4_;
        auVar83._4_4_ = fVar143 * local_2710._4_4_;
        auVar83._8_4_ = fVar145 * local_2710._8_4_;
        auVar83._12_4_ = fVar147 * local_2710._12_4_;
        auVar62 = vfmsub213ps_fma(local_2710,local_2740,auVar53);
        auVar91._0_4_ = auVar49._0_4_ * fVar113;
        auVar91._4_4_ = auVar49._4_4_ * fVar105;
        auVar91._8_4_ = auVar49._8_4_ * fVar107;
        auVar91._12_4_ = auVar49._12_4_ * fVar109;
        auVar98._0_4_ = fVar140 * auVar73._0_4_;
        auVar98._4_4_ = fVar143 * auVar73._4_4_;
        auVar98._8_4_ = fVar145 * auVar73._8_4_;
        auVar98._12_4_ = fVar147 * auVar73._12_4_;
        auVar73 = vfmsub213ps_fma(auVar73,local_2720,auVar91);
        auVar48 = vandps_avx(auVar141,auVar53);
        auVar58 = vandps_avx(auVar141,auVar91);
        auVar48 = vcmpps_avx(auVar48,auVar58,1);
        local_25e0 = vblendvps_avx(auVar73,auVar62,auVar48);
        auVar75._0_4_ = fVar104 * auVar50._0_4_;
        auVar75._4_4_ = fVar106 * auVar50._4_4_;
        auVar75._8_4_ = fVar108 * auVar50._8_4_;
        auVar75._12_4_ = fVar111 * auVar50._12_4_;
        auVar62 = vfmsub213ps_fma(auVar50,local_2740,auVar98);
        auVar92._0_4_ = local_2780._0_4_ * fVar113;
        auVar92._4_4_ = local_2780._4_4_ * fVar105;
        auVar92._8_4_ = local_2780._8_4_ * fVar107;
        auVar92._12_4_ = local_2780._12_4_ * fVar109;
        auVar73 = vfmsub213ps_fma(local_2700,local_2730,auVar92);
        auVar48 = vandps_avx(auVar141,auVar92);
        auVar58 = vandps_avx(auVar98,auVar141);
        auVar48 = vcmpps_avx(auVar48,auVar58,1);
        local_25d0 = vblendvps_avx(auVar62,auVar73,auVar48);
        auVar62 = vfmsub213ps_fma(local_2780,local_2720,auVar83);
        auVar49 = vfmsub213ps_fma(auVar49,local_2730,auVar75);
        auVar48 = vandps_avx(auVar141,auVar83);
        auVar58 = vandps_avx(auVar141,auVar75);
        auVar48 = vcmpps_avx(auVar48,auVar58,1);
        local_25c0[0] = vblendvps_avx(auVar49,auVar62,auVar48);
        auVar76._0_4_ = local_25c0[0]._0_4_ * fVar121;
        auVar76._4_4_ = local_25c0[0]._4_4_ * fVar121;
        auVar76._8_4_ = local_25c0[0]._8_4_ * fVar121;
        auVar76._12_4_ = local_25c0[0]._12_4_ * fVar121;
        auVar48 = vfmadd213ps_fma(auVar96,local_25d0,auVar76);
        auVar48 = vfmadd213ps_fma(auVar132,local_25e0,auVar48);
        auVar77._0_4_ = auVar48._0_4_ + auVar48._0_4_;
        auVar77._4_4_ = auVar48._4_4_ + auVar48._4_4_;
        auVar77._8_4_ = auVar48._8_4_ + auVar48._8_4_;
        auVar77._12_4_ = auVar48._12_4_ + auVar48._12_4_;
        auVar84._0_4_ = local_25c0[0]._0_4_ * fVar130;
        auVar84._4_4_ = local_25c0[0]._4_4_ * fVar139;
        auVar84._8_4_ = local_25c0[0]._8_4_ * fVar102;
        auVar84._12_4_ = local_25c0[0]._12_4_ * fVar110;
        auVar48 = vfmadd213ps_fma(local_26f0,local_25d0,auVar84);
        auVar58 = vfmadd213ps_fma(local_2760,local_25e0,auVar48);
        auVar48 = vrcpps_avx(auVar77);
        auVar99._8_4_ = 0x3f800000;
        auVar99._0_8_ = 0x3f8000003f800000;
        auVar99._12_4_ = 0x3f800000;
        auVar62 = vfnmadd213ps_fma(auVar48,auVar77,auVar99);
        auVar48 = vfmadd132ps_fma(auVar62,auVar48,auVar48);
        local_25f0._0_4_ = auVar48._0_4_ * (auVar58._0_4_ + auVar58._0_4_);
        local_25f0._4_4_ = auVar48._4_4_ * (auVar58._4_4_ + auVar58._4_4_);
        local_25f0._8_4_ = auVar48._8_4_ * (auVar58._8_4_ + auVar58._8_4_);
        local_25f0._12_4_ = auVar48._12_4_ * (auVar58._12_4_ + auVar58._12_4_);
        auVar47 = ZEXT1664(local_25f0);
        uVar14 = *(undefined4 *)(local_27c8 + local_27d0 * 4 + 0x30);
        auVar85._4_4_ = uVar14;
        auVar85._0_4_ = uVar14;
        auVar85._8_4_ = uVar14;
        auVar85._12_4_ = uVar14;
        auVar48 = vcmpps_avx(auVar85,local_25f0,2);
        uVar14 = *(undefined4 *)(local_27c8 + local_27d0 * 4 + 0x80);
        auVar100._4_4_ = uVar14;
        auVar100._0_4_ = uVar14;
        auVar100._8_4_ = uVar14;
        auVar100._12_4_ = uVar14;
        auVar86 = ZEXT1664(auVar100);
        auVar58 = vcmpps_avx(local_25f0,auVar100,2);
        auVar48 = vandps_avx(auVar48,auVar58);
        auVar62 = local_27c0 & auVar48;
        if ((((auVar62 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
             (auVar62 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            (auVar62 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            auVar62[0xf] < '\0') {
          auVar48 = vandps_avx(auVar48,local_27c0);
          auVar62 = vcmpps_avx(auVar77,_DAT_01f45a50,4);
          auVar49 = auVar62 & auVar48;
          if ((((auVar49 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
               (auVar49 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              (auVar49 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              auVar49[0xf] < '\0') {
            local_2750 = vandps_avx(auVar48,auVar62);
            local_2660._0_16_ = local_2570;
            pRVar17 = &local_27d9;
            local_2630 = pRVar17;
            local_2620 = local_2750;
            auVar48 = vrcpps_avx(local_2640);
            auVar61._8_4_ = 0x3f800000;
            auVar61._0_8_ = 0x3f8000003f800000;
            auVar61._12_4_ = 0x3f800000;
            auVar62 = vfnmadd213ps_fma(local_2640,auVar48,auVar61);
            auVar62 = vfmadd132ps_fma(auVar62,auVar48,auVar48);
            auVar54._8_4_ = 0x219392ef;
            auVar54._0_8_ = 0x219392ef219392ef;
            auVar54._12_4_ = 0x219392ef;
            auVar48 = vcmpps_avx(local_2580,auVar54,5);
            auVar48 = vandps_avx(auVar62,auVar48);
            auVar43._0_4_ = local_2570._0_4_ * auVar48._0_4_;
            auVar43._4_4_ = local_2570._4_4_ * auVar48._4_4_;
            auVar43._8_4_ = local_2570._8_4_ * auVar48._8_4_;
            auVar43._12_4_ = local_2570._12_4_ * auVar48._12_4_;
            local_2610 = vminps_avx(auVar43,auVar61);
            auVar44._0_4_ = auVar48._0_4_ * local_2660._16_4_;
            auVar44._4_4_ = auVar48._4_4_ * local_2660._20_4_;
            auVar44._8_4_ = auVar48._8_4_ * local_2660._24_4_;
            auVar44._12_4_ = auVar48._12_4_ * local_2660._28_4_;
            local_2600 = vminps_avx(auVar44,auVar61);
            auVar55._8_4_ = 0x7f800000;
            auVar55._0_8_ = 0x7f8000007f800000;
            auVar55._12_4_ = 0x7f800000;
            auVar48 = vblendvps_avx(auVar55,local_25f0,local_2750);
            auVar62 = vshufps_avx(auVar48,auVar48,0xb1);
            auVar62 = vminps_avx(auVar62,auVar48);
            auVar49 = vshufpd_avx(auVar62,auVar62,1);
            auVar62 = vminps_avx(auVar49,auVar62);
            auVar48 = vcmpps_avx(auVar48,auVar62,0);
            auVar49 = local_2750 & auVar48;
            auVar62 = vpcmpeqd_avx(auVar62,auVar62);
            if ((((auVar49 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                 (auVar49 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                (auVar49 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                auVar49[0xf] < '\0') {
              auVar62 = auVar48;
            }
            auVar48 = vandps_avx(local_2750,auVar62);
            auVar58 = vpcmpeqd_avx(auVar58,auVar58);
            auVar93 = ZEXT1664(auVar58);
            local_2788 = pSVar24;
            do {
              auVar48 = vpslld_avx(auVar48,0x1f);
              uVar14 = vmovmskps_avx(auVar48);
              lVar16 = 0;
              for (uVar25 = CONCAT44((int)((ulong)pRVar17 >> 0x20),uVar14); (uVar25 & 1) == 0;
                  uVar25 = uVar25 >> 1 | 0x8000000000000000) {
                lVar16 = lVar16 + 1;
              }
              local_24f0 = *(uint *)((long)&local_2560 + lVar16 * 4);
              pRVar17 = (RayHitK<4> *)(ulong)local_24f0;
              pGVar34 = (pSVar24->geometries).items[(long)pRVar17].ptr;
              if ((pGVar34->mask & *(uint *)(ray + k * 4 + 0x90)) == 0) {
                *(undefined4 *)(local_2750 + lVar16 * 4) = 0;
              }
              else {
                if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                   (pGVar34->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                  uVar25 = (ulong)(uint)((int)lVar16 << 2);
                  uVar14 = *(undefined4 *)(local_2610 + uVar25);
                  uVar3 = *(undefined4 *)(local_2600 + uVar25);
                  *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_25f0 + uVar25);
                  *(undefined4 *)(ray + k * 4 + 0xc0) = *(undefined4 *)(local_25e0 + uVar25);
                  *(undefined4 *)(ray + k * 4 + 0xd0) = *(undefined4 *)(local_25d0 + uVar25);
                  *(undefined4 *)(ray + k * 4 + 0xe0) = *(undefined4 *)(local_25c0[0] + uVar25);
                  *(undefined4 *)(ray + k * 4 + 0xf0) = uVar14;
                  *(undefined4 *)(ray + k * 4 + 0x100) = uVar3;
                  *(undefined4 *)(ray + k * 4 + 0x110) = *(undefined4 *)((long)&local_2670 + uVar25)
                  ;
                  *(uint *)(ray + k * 4 + 0x120) = local_24f0;
                  *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
                  *(uint *)(ray + k * 4 + 0x140) = context->user->instPrimID[0];
                  break;
                }
                uVar25 = (ulong)(uint)((int)lVar16 * 4);
                uVar14 = *(undefined4 *)(local_2610 + uVar25);
                local_2520._4_4_ = uVar14;
                local_2520._0_4_ = uVar14;
                local_2520._8_4_ = uVar14;
                local_2520._12_4_ = uVar14;
                local_2510 = *(undefined4 *)(local_2600 + uVar25);
                local_2500 = *(undefined4 *)((long)&local_2670 + uVar25);
                uVar14 = *(undefined4 *)(local_25e0 + uVar25);
                local_2550._4_4_ = uVar14;
                local_2550._0_4_ = uVar14;
                local_2550._8_4_ = uVar14;
                local_2550._12_4_ = uVar14;
                uVar14 = *(undefined4 *)(local_25d0 + uVar25);
                local_2540._4_4_ = uVar14;
                local_2540._0_4_ = uVar14;
                local_2540._8_4_ = uVar14;
                local_2540._12_4_ = uVar14;
                uVar14 = *(undefined4 *)(local_25c0[0] + uVar25);
                local_2530._4_4_ = uVar14;
                local_2530._0_4_ = uVar14;
                local_2530._8_4_ = uVar14;
                local_2530._12_4_ = uVar14;
                uStack_250c = local_2510;
                uStack_2508 = local_2510;
                uStack_2504 = local_2510;
                uStack_24fc = local_2500;
                uStack_24f8 = local_2500;
                uStack_24f4 = local_2500;
                uStack_24ec = local_24f0;
                uStack_24e8 = local_24f0;
                uStack_24e4 = local_24f0;
                vpcmpeqd_avx2(ZEXT1632(local_2520),ZEXT1632(local_2520));
                uStack_24dc = context->user->instID[0];
                local_24e0 = uStack_24dc;
                uStack_24d8 = uStack_24dc;
                uStack_24d4 = uStack_24dc;
                uStack_24d0 = context->user->instPrimID[0];
                uStack_24cc = uStack_24d0;
                uStack_24c8 = uStack_24d0;
                uStack_24c4 = uStack_24d0;
                *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_25f0 + uVar25);
                local_26e0 = *local_26c8;
                local_26a0 = local_26e0;
                local_2698 = pGVar34->userPtr;
                local_2690 = context->user;
                local_2680 = &local_2550;
                local_2678 = 4;
                pRVar17 = (RayHitK<4> *)pGVar34->intersectionFilterN;
                local_27a0 = auVar47._0_16_;
                local_27b0 = auVar86._0_16_;
                local_27c0._0_8_ = lVar16;
                local_2688 = ray;
                if (pRVar17 != (RayHitK<4> *)0x0) {
                  local_2760._0_8_ = pGVar34;
                  auVar48 = auVar93._0_16_;
                  pRVar17 = (RayHitK<4> *)(*(code *)pRVar17)(&local_26a0);
                  auVar86 = ZEXT1664(local_27b0);
                  auVar47 = ZEXT1664(local_27a0);
                  auVar48 = vpcmpeqd_avx(auVar48,auVar48);
                  auVar93 = ZEXT1664(auVar48);
                  pSVar24 = local_2788;
                  lVar16 = local_27c0._0_8_;
                  k = local_27d0;
                  ray = local_27c8;
                  pGVar34 = (Geometry *)local_2760._0_8_;
                }
                auVar48 = auVar93._0_16_;
                if (local_26e0 == (undefined1  [16])0x0) {
                  auVar58 = vpcmpeqd_avx((undefined1  [16])0x0,_DAT_01f45a50);
                  auVar58 = auVar58 ^ auVar48;
                }
                else {
                  pRVar17 = (RayHitK<4> *)context->args->filter;
                  if ((pRVar17 != (RayHitK<4> *)0x0) &&
                     (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                       RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar34->field_8).field_0x2 & 0x40) != 0)
                      ))) {
                    pRVar17 = (RayHitK<4> *)(*(code *)pRVar17)(&local_26a0);
                    auVar86 = ZEXT1664(local_27b0);
                    auVar47 = ZEXT1664(local_27a0);
                    auVar48 = vpcmpeqd_avx(auVar48,auVar48);
                    auVar93 = ZEXT1664(auVar48);
                    pSVar24 = local_2788;
                    lVar16 = local_27c0._0_8_;
                    k = local_27d0;
                    ray = local_27c8;
                  }
                  auVar48 = vpcmpeqd_avx(local_26e0,_DAT_01f45a50);
                  auVar58 = auVar48 ^ auVar93._0_16_;
                  if (local_26e0 != (undefined1  [16])0x0) {
                    auVar48 = auVar48 ^ auVar93._0_16_;
                    auVar62 = vmaskmovps_avx(auVar48,*local_2680);
                    *(undefined1 (*) [16])(local_2688 + 0xc0) = auVar62;
                    auVar62 = vmaskmovps_avx(auVar48,local_2680[1]);
                    *(undefined1 (*) [16])(local_2688 + 0xd0) = auVar62;
                    auVar62 = vmaskmovps_avx(auVar48,local_2680[2]);
                    *(undefined1 (*) [16])(local_2688 + 0xe0) = auVar62;
                    auVar62 = vmaskmovps_avx(auVar48,local_2680[3]);
                    *(undefined1 (*) [16])(local_2688 + 0xf0) = auVar62;
                    auVar62 = vmaskmovps_avx(auVar48,local_2680[4]);
                    *(undefined1 (*) [16])(local_2688 + 0x100) = auVar62;
                    auVar62 = vmaskmovps_avx(auVar48,local_2680[5]);
                    *(undefined1 (*) [16])(local_2688 + 0x110) = auVar62;
                    auVar62 = vmaskmovps_avx(auVar48,local_2680[6]);
                    *(undefined1 (*) [16])(local_2688 + 0x120) = auVar62;
                    auVar62 = vmaskmovps_avx(auVar48,local_2680[7]);
                    *(undefined1 (*) [16])(local_2688 + 0x130) = auVar62;
                    auVar48 = vmaskmovps_avx(auVar48,local_2680[8]);
                    *(undefined1 (*) [16])(local_2688 + 0x140) = auVar48;
                    pRVar17 = local_2688;
                  }
                }
                auVar45._8_8_ = 0x100000001;
                auVar45._0_8_ = 0x100000001;
                if ((auVar45 & auVar58) == (undefined1  [16])0x0) {
                  *(int *)(ray + k * 4 + 0x80) = auVar86._0_4_;
                }
                else {
                  auVar86 = ZEXT464(*(uint *)(ray + k * 4 + 0x80));
                }
                *(undefined4 *)(local_2750 + lVar16 * 4) = 0;
                uVar14 = auVar86._0_4_;
                auVar46._4_4_ = uVar14;
                auVar46._0_4_ = uVar14;
                auVar46._8_4_ = uVar14;
                auVar46._12_4_ = uVar14;
                auVar48 = vcmpps_avx(auVar47._0_16_,auVar46,2);
                local_2750 = vandps_avx(auVar48,local_2750);
              }
              if ((((local_2750 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                   (local_2750 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                  (local_2750 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                  -1 < local_2750[0xf]) break;
              auVar56._8_4_ = 0x7f800000;
              auVar56._0_8_ = 0x7f8000007f800000;
              auVar56._12_4_ = 0x7f800000;
              auVar48 = vblendvps_avx(auVar56,auVar47._0_16_,local_2750);
              auVar58 = vshufps_avx(auVar48,auVar48,0xb1);
              auVar58 = vminps_avx(auVar58,auVar48);
              auVar62 = vshufpd_avx(auVar58,auVar58,1);
              auVar58 = vminps_avx(auVar62,auVar58);
              auVar58 = vcmpps_avx(auVar48,auVar58,0);
              auVar62 = local_2750 & auVar58;
              auVar48 = local_2750;
              if ((((auVar62 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                   (auVar62 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (auVar62 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  auVar62[0xf] < '\0') {
                auVar48 = vandps_avx(auVar58,local_2750);
              }
              auVar48 = vpcmpgtd_avx(ZEXT816(0) << 0x20,auVar48);
            } while( true );
          }
        }
      }
      auVar93 = ZEXT3264(local_23c0);
      auVar94 = ZEXT3264(local_23e0);
      auVar101 = ZEXT3264(local_2400);
      auVar86 = ZEXT3264(local_25a0);
      uVar25 = local_27d8;
      uVar32 = local_26c0;
      fVar102 = local_2420;
      fVar104 = fStack_241c;
      fVar105 = fStack_2418;
      fVar106 = fStack_2414;
      fVar107 = fStack_2410;
      fVar108 = fStack_240c;
      fVar109 = fStack_2408;
      fVar110 = local_2440;
      fVar111 = fStack_243c;
      fVar140 = fStack_2438;
      fVar143 = fStack_2434;
      fVar145 = fStack_2430;
      fVar147 = fStack_242c;
      fVar112 = fStack_2428;
      fVar113 = local_2460;
      fVar115 = fStack_245c;
      fVar116 = fStack_2458;
      fVar117 = fStack_2454;
      fVar118 = fStack_2450;
      fVar119 = fStack_244c;
      fVar120 = fStack_2448;
      fVar121 = local_2480;
      fVar124 = fStack_247c;
      fVar125 = fStack_2478;
      fVar126 = fStack_2474;
      fVar127 = fStack_2470;
      fVar128 = fStack_246c;
      fVar129 = fStack_2468;
      fVar130 = local_24a0;
      fVar133 = fStack_249c;
      fVar134 = fStack_2498;
      fVar135 = fStack_2494;
      fVar136 = fStack_2490;
      fVar137 = fStack_248c;
      fVar138 = fStack_2488;
      fVar139 = local_24c0;
      fVar142 = fStack_24bc;
      fVar144 = fStack_24b8;
      fVar146 = fStack_24b4;
      fVar148 = fStack_24b0;
      fVar149 = fStack_24ac;
      fVar150 = fStack_24a8;
    }
    uVar14 = *(undefined4 *)(ray + k * 4 + 0x80);
    auVar47 = ZEXT3264(CONCAT428(uVar14,CONCAT424(uVar14,CONCAT420(uVar14,CONCAT416(uVar14,CONCAT412
                                                  (uVar14,CONCAT48(uVar14,CONCAT44(uVar14,uVar14))))
                                                  ))));
  } while( true );
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::intersect1(Accel::Intersectors* This,
                                                                                                const BVH* bvh,
                                                                                                NodeRef root,
                                                                                                size_t k,
                                                                                                Precalculations& pre,
                                                                                                RayHitK<K>& ray,
                                                                                                const TravRayK<K, robust>& tray,
                                                                                                RayQueryContext* context)
    {
      /* stack state */
      StackItemT<NodeRef> stack[stackSizeSingle];  // stack of nodes
      StackItemT<NodeRef>* stackPtr = stack + 1;   // current stack pointer
      StackItemT<NodeRef>* stackEnd = stack + stackSizeSingle;
      stack[0].ptr = root;
      stack[0].dist = neg_inf;

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray1;
      tray1.template init<K>(k, tray.org, tray.dir, tray.rdir, tray.nearXYZ, tray.tnear[k], tray.tfar[k]);

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = NodeRef(stackPtr->ptr);

        /* if popped node is too far, pop next one */
        if (unlikely(*(float*)&stackPtr->dist > ray.tfar[k]))
          continue;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(normal.trav_nodes, 1, 1, 1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray1, ray.time()[k], tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(normal.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          BVHNNodeTraverser1Hit<N, types>::traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(normal.trav_leaves, 1, 1, 1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);

        size_t lazy_node = 0;
        PrimitiveIntersectorK::intersect(This, pre, ray, k, context, prim, num, tray1, lazy_node);

        tray1.tfar = ray.tfar[k];

        if (unlikely(lazy_node)) {
          stackPtr->ptr = lazy_node;
          stackPtr->dist = neg_inf;
          stackPtr++;
        }
      }
    }